

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O1

void __thiscall
visitor_test_should_parse_utc_timestamp_with_milliseconds_Test::TestBody
          (visitor_test_should_parse_utc_timestamp_with_milliseconds_Test *this)

{
  char **this_00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar1;
  bool bVar2;
  char *pcVar3;
  undefined1 local_88 [8];
  Time time;
  time_t t;
  tm tm;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  Fixpp::details::LexicalCast<Fixpp::Type::UTCTimestamp>::cast
            ((Time *)local_88,"20171105-14:09:30.125",0x15);
  time.m_usec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)local_88;
  tm.tm_wday = 0;
  tm.tm_yday = 0;
  tm.tm_isdst = 0;
  tm._36_4_ = 0;
  tm.tm_hour = 0;
  tm.tm_mday = 0;
  tm.tm_mon = 0;
  tm.tm_year = 0;
  t = 0;
  tm.tm_sec = 0;
  tm.tm_min = 0;
  tm.tm_gmtoff = 0;
  gmtime_r((time_t *)&time.m_usec,(tm *)&t);
  local_18.ptr_._0_4_ = 0x75;
  this_00 = &tm.tm_zone;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)this_00,"tm.tm_year","117",&tm.tm_mday,(int *)&local_18);
  if ((char)tm.tm_zone == '\0') {
    testing::Message::Message((Message *)&local_18);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x29f,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_18.ptr_ + 8))();
      }
      local_18.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_18.ptr_._0_4_ = 10;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)this_00,"tm.tm_mon","10",&tm.tm_hour,(int *)&local_18);
    if ((char)tm.tm_zone == '\0') {
      testing::Message::Message((Message *)&local_18);
      if (gtest_ar._0_8_ == 0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                 ,0x2a0,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      if (local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_18.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_18.ptr_ + 8))();
        }
        local_18.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_18.ptr_._0_4_ = 5;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)this_00,"tm.tm_mday","5",&tm.tm_min,(int *)&local_18);
      if ((char)tm.tm_zone == '\0') {
        testing::Message::Message((Message *)&local_18);
        if (gtest_ar._0_8_ == 0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                   ,0x2a1,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
        if (local_18.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_18.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_18.ptr_ + 8))();
          }
          local_18.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_18.ptr_._0_4_ = 0xe;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)this_00,"tm.tm_hour","14",&tm.tm_sec,(int *)&local_18);
        if ((char)tm.tm_zone == '\0') {
          testing::Message::Message((Message *)&local_18);
          if (gtest_ar._0_8_ == 0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                     ,0x2a2,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
          if (local_18.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_18.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_18.ptr_ + 8))();
            }
            local_18.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          local_18.ptr_._0_4_ = 9;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)this_00,"tm.tm_min","9",(int *)((long)&t + 4),(int *)&local_18);
          if ((char)tm.tm_zone == '\0') {
            testing::Message::Message((Message *)&local_18);
            if (gtest_ar._0_8_ == 0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                       ,0x2a3,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
            if (local_18.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 (local_18.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_18.ptr_ + 8))();
              }
              local_18.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_18.ptr_._0_4_ = 0x1e;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)this_00,"tm.tm_sec","30",(int *)&t,(int *)&local_18);
            if ((char)tm.tm_zone == '\0') {
              testing::Message::Message((Message *)&local_18);
              if (gtest_ar._0_8_ == 0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                         ,0x2a4,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
              if (local_18.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar2 = testing::internal::IsTrue(true);
                if ((bVar2) &&
                   (local_18.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_18.ptr_ + 8))();
                }
                local_18.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              local_18.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   time.m_time;
              sVar1.ptr_ = local_18.ptr_;
              local_18.ptr_._4_1_ = (char)((ulong)time.m_time >> 0x20);
              local_18.ptr_ = sVar1.ptr_;
              if (local_18.ptr_._4_1_ == '\0') {
                std::__throw_bad_optional_access();
              }
              gtest_ar.message_.ptr_._0_4_ = 0x7d;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)this_00,"time.msec().value()","125",(int *)&local_18,
                         (int *)&gtest_ar.message_);
              if ((char)tm.tm_zone == '\0') {
                testing::Message::Message((Message *)&local_18);
                if (gtest_ar._0_8_ == 0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = *(char **)gtest_ar._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                           ,0x2a6,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
                if (local_18.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  bVar2 = testing::internal::IsTrue(true);
                  if ((bVar2) &&
                     (local_18.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     )) {
                    (**(code **)(*(long *)local_18.ptr_ + 8))();
                  }
                  local_18.ptr_ =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x0;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                local_18.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (CONCAT71(local_18.ptr_._1_7_,
                               time.m_msec.super__Optional_base<int,_true,_true>._M_payload.
                               super__Optional_payload_base<int>._M_engaged) & 0xffffffffffffff01);
                gtest_ar.message_.ptr_._0_4_ = (uint)gtest_ar.message_.ptr_ & 0xffffff00;
                testing::internal::CmpHelperEQ<bool,bool>
                          ((internal *)this_00,"time.usec().has_value()","false",(bool *)&local_18,
                           (bool *)&gtest_ar.message_);
                if ((char)tm.tm_zone == '\0') {
                  testing::Message::Message((Message *)&local_18);
                  if (gtest_ar._0_8_ == 0) {
                    pcVar3 = "";
                  }
                  else {
                    pcVar3 = *(char **)gtest_ar._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                             ,0x2a7,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_)
                  ;
                  if (local_18.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    bVar2 = testing::internal::IsTrue(true);
                    if ((bVar2) &&
                       (local_18.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0)) {
                      (**(code **)(*(long *)local_18.ptr_ + 8))();
                    }
                    local_18.ptr_ =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x0;
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(visitor_test, should_parse_utc_timestamp_with_milliseconds)
{
    const char* str = "20171105-14:09:30.125";
    auto time = Fixpp::details::LexicalCast<Fixpp::Type::UTCTimestamp>::cast(str, std::strlen(str));

    auto t = time.time();
    std::tm tm{};
    gmtime_r(&t, &tm);

    ASSERT_EQ(tm.tm_year, 117);
    ASSERT_EQ(tm.tm_mon, 10);
    ASSERT_EQ(tm.tm_mday, 5);
    ASSERT_EQ(tm.tm_hour, 14);
    ASSERT_EQ(tm.tm_min, 9);
    ASSERT_EQ(tm.tm_sec, 30);

    ASSERT_EQ(time.msec().value(), 125);
    ASSERT_EQ(time.usec().has_value(), false);
}